

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O0

ComparisonResult __thiscall
google::protobuf::util::SimpleFieldComparator::SimpleCompare
          (SimpleFieldComparator *this,Message *message_1,Message *message_2,FieldDescriptor *field,
          int index_1,int index_2,FieldContext *param_6)

{
  bool bVar1;
  bool bVar2;
  CppType CVar3;
  int32_t iVar4;
  int32_t iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  Reflection *this_00;
  Reflection *this_01;
  EnumValueDescriptor *pEVar8;
  EnumValueDescriptor *pEVar9;
  int64_t iVar10;
  int64_t iVar11;
  string *psVar12;
  string *psVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  LogMessage *pLVar16;
  DescriptorStringView psVar17;
  float fVar18;
  float fVar19;
  double dVar20;
  double dVar21;
  CppType local_f4;
  LogMessageFatal local_f0 [23];
  Voidify local_d9;
  undefined1 local_d8 [8];
  string scratch2_1;
  string scratch1_1;
  undefined1 local_88 [8];
  string scratch2;
  string scratch1;
  Reflection *reflection_2;
  Reflection *reflection_1;
  int index_2_local;
  int index_1_local;
  FieldDescriptor *field_local;
  Message *message_2_local;
  Message *message_1_local;
  SimpleFieldComparator *this_local;
  
  this_00 = Message::GetReflection(message_1);
  this_01 = Message::GetReflection(message_2);
  CVar3 = FieldDescriptor::cpp_type(field);
  switch(CVar3) {
  case CPPTYPE_INT32:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      iVar4 = Reflection::GetRepeatedInt32(this_00,message_1,field,index_1);
      iVar5 = Reflection::GetRepeatedInt32(this_01,message_2,field,index_2);
      bVar2 = CompareInt32(this,field,iVar4,iVar5);
      this_local._4_4_ = ResultFromBoolean(this,bVar2);
    }
    else {
      iVar4 = Reflection::GetInt32(this_00,message_1,field);
      iVar5 = Reflection::GetInt32(this_01,message_2,field);
      bVar2 = CompareInt32(this,field,iVar4,iVar5);
      this_local._4_4_ = ResultFromBoolean(this,bVar2);
    }
    break;
  case CPPTYPE_INT64:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      iVar10 = Reflection::GetRepeatedInt64(this_00,message_1,field,index_1);
      iVar11 = Reflection::GetRepeatedInt64(this_01,message_2,field,index_2);
      bVar2 = CompareInt64(this,field,iVar10,iVar11);
      this_local._4_4_ = ResultFromBoolean(this,bVar2);
    }
    else {
      iVar10 = Reflection::GetInt64(this_00,message_1,field);
      iVar11 = Reflection::GetInt64(this_01,message_2,field);
      bVar2 = CompareInt64(this,field,iVar10,iVar11);
      this_local._4_4_ = ResultFromBoolean(this,bVar2);
    }
    break;
  case CPPTYPE_UINT32:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      uVar6 = Reflection::GetRepeatedUInt32(this_00,message_1,field,index_1);
      uVar7 = Reflection::GetRepeatedUInt32(this_01,message_2,field,index_2);
      bVar2 = CompareUInt32(this,field,uVar6,uVar7);
      this_local._4_4_ = ResultFromBoolean(this,bVar2);
    }
    else {
      uVar6 = Reflection::GetUInt32(this_00,message_1,field);
      uVar7 = Reflection::GetUInt32(this_01,message_2,field);
      bVar2 = CompareUInt32(this,field,uVar6,uVar7);
      this_local._4_4_ = ResultFromBoolean(this,bVar2);
    }
    break;
  case CPPTYPE_UINT64:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      uVar14 = Reflection::GetRepeatedUInt64(this_00,message_1,field,index_1);
      uVar15 = Reflection::GetRepeatedUInt64(this_01,message_2,field,index_2);
      bVar2 = CompareUInt64(this,field,uVar14,uVar15);
      this_local._4_4_ = ResultFromBoolean(this,bVar2);
    }
    else {
      uVar14 = Reflection::GetUInt64(this_00,message_1,field);
      uVar15 = Reflection::GetUInt64(this_01,message_2,field);
      bVar2 = CompareUInt64(this,field,uVar14,uVar15);
      this_local._4_4_ = ResultFromBoolean(this,bVar2);
    }
    break;
  case CPPTYPE_DOUBLE:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      dVar20 = Reflection::GetRepeatedDouble(this_00,message_1,field,index_1);
      dVar21 = Reflection::GetRepeatedDouble(this_01,message_2,field,index_2);
      bVar2 = CompareDouble(this,field,dVar20,dVar21);
      this_local._4_4_ = ResultFromBoolean(this,bVar2);
    }
    else {
      dVar20 = Reflection::GetDouble(this_00,message_1,field);
      dVar21 = Reflection::GetDouble(this_01,message_2,field);
      bVar2 = CompareDouble(this,field,dVar20,dVar21);
      this_local._4_4_ = ResultFromBoolean(this,bVar2);
    }
    break;
  case CPPTYPE_FLOAT:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      fVar18 = Reflection::GetRepeatedFloat(this_00,message_1,field,index_1);
      fVar19 = Reflection::GetRepeatedFloat(this_01,message_2,field,index_2);
      bVar2 = CompareFloat(this,field,fVar18,fVar19);
      this_local._4_4_ = ResultFromBoolean(this,bVar2);
    }
    else {
      fVar18 = Reflection::GetFloat(this_00,message_1,field);
      fVar19 = Reflection::GetFloat(this_01,message_2,field);
      bVar2 = CompareFloat(this,field,fVar18,fVar19);
      this_local._4_4_ = ResultFromBoolean(this,bVar2);
    }
    break;
  case CPPTYPE_BOOL:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      bVar2 = Reflection::GetRepeatedBool(this_00,message_1,field,index_1);
      bVar1 = Reflection::GetRepeatedBool(this_01,message_2,field,index_2);
      bVar2 = CompareBool(this,field,bVar2,bVar1);
      this_local._4_4_ = ResultFromBoolean(this,bVar2);
    }
    else {
      bVar2 = Reflection::GetBool(this_00,message_1,field);
      bVar1 = Reflection::GetBool(this_01,message_2,field);
      bVar2 = CompareBool(this,field,bVar2,bVar1);
      this_local._4_4_ = ResultFromBoolean(this,bVar2);
    }
    break;
  case CPPTYPE_ENUM:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      pEVar8 = Reflection::GetRepeatedEnum(this_00,message_1,field,index_1);
      pEVar9 = Reflection::GetRepeatedEnum(this_01,message_2,field,index_2);
      bVar2 = CompareEnum(this,field,pEVar8,pEVar9);
      this_local._4_4_ = ResultFromBoolean(this,bVar2);
    }
    else {
      pEVar8 = Reflection::GetEnum(this_00,message_1,field);
      pEVar9 = Reflection::GetEnum(this_01,message_2,field);
      bVar2 = CompareEnum(this,field,pEVar8,pEVar9);
      this_local._4_4_ = ResultFromBoolean(this,bVar2);
    }
    break;
  case CPPTYPE_STRING:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      std::__cxx11::string::string((string *)(scratch2.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_88);
      psVar12 = Reflection::GetRepeatedStringReference
                          (this_00,message_1,field,index_1,
                           (string *)(scratch2.field_2._M_local_buf + 8));
      psVar13 = Reflection::GetRepeatedStringReference
                          (this_01,message_2,field,index_2,(string *)local_88);
      bVar2 = CompareString(this,field,psVar12,psVar13);
      this_local._4_4_ = ResultFromBoolean(this,bVar2);
      std::__cxx11::string::~string((string *)local_88);
      std::__cxx11::string::~string((string *)(scratch2.field_2._M_local_buf + 8));
    }
    else {
      std::__cxx11::string::string((string *)(scratch2_1.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_d8);
      psVar12 = Reflection::GetStringReference
                          (this_00,message_1,field,(string *)(scratch2_1.field_2._M_local_buf + 8));
      psVar13 = Reflection::GetStringReference(this_01,message_2,field,(string *)local_d8);
      bVar2 = CompareString(this,field,psVar12,psVar13);
      this_local._4_4_ = ResultFromBoolean(this,bVar2);
      std::__cxx11::string::~string((string *)local_d8);
      std::__cxx11::string::~string((string *)(scratch2_1.field_2._M_local_buf + 8));
    }
    break;
  case CPPTYPE_MESSAGE:
    this_local._4_4_ = RECURSE;
    break;
  default:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/util/field_comparator.cc"
               ,0x84);
    pLVar16 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_f0);
    pLVar16 = absl::lts_20240722::log_internal::LogMessage::operator<<
                        (pLVar16,(char (*) [30])"No comparison code for field ");
    psVar17 = FieldDescriptor::full_name_abi_cxx11_(field);
    pLVar16 = (LogMessage *)
              absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar16,(string *)psVar17);
    pLVar16 = absl::lts_20240722::log_internal::LogMessage::operator<<
                        (pLVar16,(char (*) [15])" of CppType = ");
    local_f4 = FieldDescriptor::cpp_type(field);
    pLVar16 = absl::lts_20240722::log_internal::LogMessage::
              operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>
                        (pLVar16,&local_f4);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_d9,pLVar16);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_f0);
  }
  return this_local._4_4_;
}

Assistant:

FieldComparator::ComparisonResult SimpleFieldComparator::SimpleCompare(
    const Message& message_1, const Message& message_2,
    const FieldDescriptor* field, int index_1, int index_2,
    const util::FieldContext* /*field_context*/) {
  const Reflection* reflection_1 = message_1.GetReflection();
  const Reflection* reflection_2 = message_2.GetReflection();

  switch (field->cpp_type()) {
#define COMPARE_FIELD(METHOD)                                                 \
  if (field->is_repeated()) {                                                 \
    return ResultFromBoolean(Compare##METHOD(                                 \
        *field, reflection_1->GetRepeated##METHOD(message_1, field, index_1), \
        reflection_2->GetRepeated##METHOD(message_2, field, index_2)));       \
  } else {                                                                    \
    return ResultFromBoolean(                                                 \
        Compare##METHOD(*field, reflection_1->Get##METHOD(message_1, field),  \
                        reflection_2->Get##METHOD(message_2, field)));        \
  }                                                                           \
  break;  // Make sure no fall-through is introduced.

    case FieldDescriptor::CPPTYPE_BOOL:
      COMPARE_FIELD(Bool);
    case FieldDescriptor::CPPTYPE_DOUBLE:
      COMPARE_FIELD(Double);
    case FieldDescriptor::CPPTYPE_ENUM:
      COMPARE_FIELD(Enum);
    case FieldDescriptor::CPPTYPE_FLOAT:
      COMPARE_FIELD(Float);
    case FieldDescriptor::CPPTYPE_INT32:
      COMPARE_FIELD(Int32);
    case FieldDescriptor::CPPTYPE_INT64:
      COMPARE_FIELD(Int64);
    case FieldDescriptor::CPPTYPE_STRING:
      if (field->is_repeated()) {
        // Allocate scratch strings to store the result if a conversion is
        // needed.
        std::string scratch1;
        std::string scratch2;
        return ResultFromBoolean(
            CompareString(*field,
                          reflection_1->GetRepeatedStringReference(
                              message_1, field, index_1, &scratch1),
                          reflection_2->GetRepeatedStringReference(
                              message_2, field, index_2, &scratch2)));
      } else {
        // Allocate scratch strings to store the result if a conversion is
        // needed.
        std::string scratch1;
        std::string scratch2;
        return ResultFromBoolean(CompareString(
            *field,
            reflection_1->GetStringReference(message_1, field, &scratch1),
            reflection_2->GetStringReference(message_2, field, &scratch2)));
      }
      break;
    case FieldDescriptor::CPPTYPE_UINT32:
      COMPARE_FIELD(UInt32);
    case FieldDescriptor::CPPTYPE_UINT64:
      COMPARE_FIELD(UInt64);

#undef COMPARE_FIELD

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return RECURSE;

    default:
      ABSL_LOG(FATAL) << "No comparison code for field " << field->full_name()
                      << " of CppType = " << field->cpp_type();
      return DIFFERENT;
  }
}